

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  uint uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  size_t sVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  undefined2 uVar13;
  ulong uVar14;
  uint uVar15;
  short sVar16;
  size_t pos;
  long lVar17;
  U64 sv;
  long lVar18;
  U32 s_1;
  ulong uVar19;
  U32 s;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  bVar9 = (byte)tableLog;
  uVar15 = 1 << (bVar9 & 0x1f);
  sVar8 = 0xffffffffffffffd2;
  if (((maxSymbolValue < 0x100) &&
      (uVar14 = (ulong)(maxSymbolValue + 1), (1L << (bVar9 & 0x3f)) + uVar14 * 2 + 8 <= wkspSize))
     && (sVar8 = 0xffffffffffffffd4, tableLog < 0xd)) {
    uVar11 = (ulong)maxSymbolValue;
    lVar3 = uVar11 * 2 + 2;
    uVar1 = uVar15 - 1;
    uVar19 = (ulong)uVar1;
    uVar13 = 1;
    uVar20 = 0;
    do {
      sVar16 = normalizedCounter[uVar20];
      if (sVar16 == -1) {
        *(char *)((long)dt + uVar19 * 4 + 6) = (char)uVar20;
        sVar16 = 1;
        uVar19 = (ulong)((int)uVar19 - 1);
      }
      else if ((int)((uint)(0x8000 << (bVar9 & 0x1f)) >> 0x10) <= (int)sVar16) {
        uVar13 = 0;
      }
      *(short *)((long)workSpace + uVar20 * 2) = sVar16;
      uVar20 = uVar20 + 1;
    } while (uVar14 != uVar20);
    *(short *)dt = (short)tableLog;
    *(undefined2 *)((long)dt + 2) = uVar13;
    auVar6 = _DAT_01d84390;
    auVar5 = _DAT_01d84380;
    if ((uint)uVar19 == uVar1) {
      iVar7 = (uVar15 >> 1) + (uVar15 >> 3) + 3;
      uVar19 = 0;
      lVar17 = 0;
      lVar18 = 0;
      do {
        uVar2 = normalizedCounter[uVar19];
        *(long *)((long)workSpace + lVar17 + lVar3) = lVar18;
        if (8 < (long)(short)uVar2) {
          uVar12 = 0x10;
          if (0x10 < uVar2) {
            uVar12 = (int)(short)uVar2;
          }
          lVar4 = lVar17 + lVar3;
          uVar21 = (ulong)(uVar12 & 0xffff) - 9;
          auVar24._8_4_ = (int)uVar21;
          auVar24._0_8_ = uVar21;
          auVar24._12_4_ = (int)(uVar21 >> 0x20);
          auVar22._0_8_ = uVar21 >> 3;
          auVar22._8_8_ = auVar24._8_8_ >> 3;
          auVar22 = auVar22 ^ auVar6;
          uVar20 = 0;
          do {
            auVar23._8_4_ = (int)uVar20;
            auVar23._0_8_ = uVar20;
            auVar23._12_4_ = (int)(uVar20 >> 0x20);
            auVar24 = (auVar23 | auVar5) ^ auVar6;
            if ((bool)(~(auVar22._4_4_ < auVar24._4_4_ ||
                        auVar22._0_4_ < auVar24._0_4_ && auVar24._4_4_ == auVar22._4_4_) & 1)) {
              *(long *)((long)workSpace + uVar20 * 8 + lVar4 + 8) = lVar18;
            }
            if (auVar24._12_4_ <= auVar22._12_4_ &&
                (auVar24._8_4_ <= auVar22._8_4_ || auVar24._12_4_ != auVar22._12_4_)) {
              *(long *)((long)workSpace + uVar20 * 8 + lVar4 + 0x10) = lVar18;
            }
            uVar20 = uVar20 + 2;
          } while (((uVar21 >> 3) + 2 & 0xfffffffffffffffe) != uVar20);
        }
        lVar17 = lVar17 + (short)uVar2;
        uVar19 = uVar19 + 1;
        lVar18 = lVar18 + 0x101010101010101;
      } while (uVar19 != uVar14);
      uVar14 = 0;
      uVar12 = 0;
      do {
        *(undefined1 *)((long)dt + (ulong)(uVar12 & uVar1) * 4 + 6) =
             *(undefined1 *)((long)workSpace + uVar14 + uVar11 * 2 + 2);
        *(undefined1 *)((long)dt + (ulong)(uVar12 + iVar7 & uVar1) * 4 + 6) =
             *(undefined1 *)((long)workSpace + uVar14 + uVar11 * 2 + 3);
        uVar12 = uVar12 + iVar7 * 2 & uVar1;
        uVar14 = uVar14 + 2;
      } while (uVar14 < uVar15);
    }
    else {
      uVar11 = 0;
      uVar12 = 0;
      do {
        sVar16 = normalizedCounter[uVar11];
        if (0 < sVar16) {
          iVar7 = 0;
          do {
            *(char *)((long)dt + (ulong)uVar12 * 4 + 6) = (char)uVar11;
            do {
              uVar12 = uVar12 + (uVar15 >> 1) + (uVar15 >> 3) + 3 & uVar1;
            } while ((uint)uVar19 < uVar12);
            iVar7 = iVar7 + 1;
          } while (iVar7 != sVar16);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar14);
      if (uVar12 != 0) {
        return 0xffffffffffffffff;
      }
    }
    sVar8 = 0;
    uVar14 = 0;
    do {
      uVar19 = (ulong)*(byte *)((long)dt + uVar14 * 4 + 6);
      uVar2 = *(ushort *)((long)workSpace + uVar19 * 2);
      *(ushort *)((long)workSpace + uVar19 * 2) = uVar2 + 1;
      iVar7 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      bVar10 = bVar9 - (char)iVar7;
      *(byte *)((long)dt + uVar14 * 4 + 7) = bVar10;
      *(ushort *)(dt + uVar14 + 1) = (uVar2 << (bVar10 & 0x1f)) - (short)uVar15;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  return sVar8;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = (U16)normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += (size_t)n;
        }   }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}